

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.hh
# Opt level: O2

integer_t __thiscall
tchecker::vm_t::interpret_instruction
          (vm_t *this,bytecode_t **bytecode,intval_t *intval,clock_constraint_container_t *clkconstr
          ,clock_reset_container_t *clkreset)

{
  bytecode_t *pbVar1;
  pointer plVar2;
  long lVar3;
  unsigned_short uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  ostream *poVar10;
  out_of_range *this_00;
  int *piVar11;
  uint *puVar12;
  runtime_error *this_01;
  integer_t iVar13;
  bool bVar14;
  ineq_cmp_t local_1fc;
  uint left_id;
  uint right_id;
  int value;
  undefined4 uStack_1b4;
  undefined1 local_1a8 [376];
  
  pbVar1 = *bytecode;
  iVar13 = 1;
  switch(*pbVar1) {
  case 0:
    iVar6 = top_and_pop<int>(this);
    if ((this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      this->_return = true;
      return iVar6;
    }
    __assert_fail("size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/vm/vm.hh"
                  ,0xed,
                  "tchecker::integer_t tchecker::vm_t::interpret_instruction(const tchecker::bytecode_t *&, tchecker::intval_t &, tchecker::clock_constraint_container_t &, tchecker::clock_reset_container_t &)"
                 );
  case 1:
    iVar6 = top<int>(this);
    if (iVar6 != 0) goto LAB_00193e31;
    plVar2 = (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_finish != plVar2) {
      (this->_stack).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
      ._M_finish = plVar2;
    }
    this->_return = true;
    goto LAB_00193ef2;
  case 2:
    lVar8 = pbVar1[1];
    *bytecode = pbVar1 + 2;
    lVar3 = pbVar1[2];
    lVar9 = top<long>(this);
    if ((int)lVar8 != lVar8) {
      __assert_fail("contains_value<tchecker::integer_t>(l)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/vm/vm.hh"
                    ,0x103,
                    "tchecker::integer_t tchecker::vm_t::interpret_instruction(const tchecker::bytecode_t *&, tchecker::intval_t &, tchecker::clock_constraint_container_t &, tchecker::clock_reset_container_t &)"
                   );
    }
    if ((int)lVar3 != lVar3) {
      __assert_fail("contains_value<tchecker::integer_t>(h)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/vm/vm.hh"
                    ,0x104,
                    "tchecker::integer_t tchecker::vm_t::interpret_instruction(const tchecker::bytecode_t *&, tchecker::intval_t &, tchecker::clock_constraint_container_t &, tchecker::clock_reset_container_t &)"
                   );
    }
    if ((int)lVar9 != lVar9) {
      __assert_fail("contains_value<tchecker::integer_t>(offset)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/vm/vm.hh"
                    ,0x105,
                    "tchecker::integer_t tchecker::vm_t::interpret_instruction(const tchecker::bytecode_t *&, tchecker::intval_t &, tchecker::clock_constraint_container_t &, tchecker::clock_reset_container_t &)"
                   );
    }
    if ((lVar9 < lVar8) || (lVar3 < lVar9)) {
      std::__cxx11::stringstream::stringstream((stringstream *)&value);
      poVar10 = std::ostream::_M_insert<long>((long)local_1a8);
      poVar10 = std::operator<<(poVar10," out of [");
      poVar10 = std::ostream::_M_insert<long>((long)poVar10);
      poVar10 = std::operator<<(poVar10,", ");
      poVar10 = std::ostream::_M_insert<long>((long)poVar10);
      std::operator<<(poVar10,"]");
      this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&right_id,
                     "out-of-bounds value: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&left_id);
      std::out_of_range::out_of_range(this_00,(string *)&right_id);
      __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    goto LAB_00193e31;
  case 3:
    *bytecode = pbVar1 + pbVar1[1] + 1;
    return 1;
  case 4:
    *bytecode = pbVar1 + 1;
    lVar8 = pbVar1[1];
    iVar6 = top_and_pop<int>(this);
    if (iVar6 != 0) {
      return 1;
    }
    *bytecode = *bytecode + lVar8;
    goto LAB_00193ef2;
  case 5:
    *bytecode = pbVar1 + 1;
    push<long>(this,pbVar1[1]);
    goto LAB_00193e31;
  case 6:
    uVar4 = top_and_pop<unsigned_short>(this);
    if ((intval->super_integer_array_t).super_intval_base_t.super_array_capacity_t<unsigned_short>.
        _capacity <= uVar4) {
      __assert_fail("id < intval.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/vm/vm.hh"
                    ,0x133,
                    "tchecker::integer_t tchecker::vm_t::interpret_instruction(const tchecker::bytecode_t *&, tchecker::intval_t &, tchecker::clock_constraint_container_t &, tchecker::clock_reset_container_t &)"
                   );
    }
    puVar12 = (uint *)make_array_t<int,_4UL,_tchecker::intval_base_t>::operator[]
                                (&intval->super_integer_array_t,uVar4);
    goto LAB_00193cf1;
  case 7:
    iVar6 = top_and_pop<int>(this);
    uVar4 = top_and_pop<unsigned_short>(this);
    if ((intval->super_integer_array_t).super_intval_base_t.super_array_capacity_t<unsigned_short>.
        _capacity <= uVar4) {
      __assert_fail("id < intval.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/vm/vm.hh"
                    ,0x13c,
                    "tchecker::integer_t tchecker::vm_t::interpret_instruction(const tchecker::bytecode_t *&, tchecker::intval_t &, tchecker::clock_constraint_container_t &, tchecker::clock_reset_container_t &)"
                   );
    }
    piVar11 = make_array_t<int,_4UL,_tchecker::intval_base_t>::operator[]
                        (&intval->super_integer_array_t,uVar4);
    goto LAB_00193ec2;
  case 8:
    iVar6 = top_and_pop<int>(this);
    iVar5 = top_and_pop<int>(this);
    uVar7 = (uint)(iVar6 != 0 && iVar5 != 0);
    break;
  case 9:
    iVar6 = top_and_pop<int>(this);
    iVar5 = top_and_pop<int>(this);
    uVar7 = iVar5 - iVar6;
    break;
  case 10:
    iVar6 = top_and_pop<int>(this);
    iVar5 = top_and_pop<int>(this);
    uVar7 = iVar5 / iVar6;
    break;
  case 0xb:
    iVar6 = top_and_pop<int>(this);
    iVar5 = top_and_pop<int>(this);
    bVar14 = iVar5 == iVar6;
    goto LAB_00193e09;
  case 0xc:
    iVar6 = top_and_pop<int>(this);
    iVar5 = top_and_pop<int>(this);
    uVar7 = (uint)(iVar6 <= iVar5);
    break;
  case 0xd:
    iVar6 = top_and_pop<int>(this);
    iVar5 = top_and_pop<int>(this);
    uVar7 = (uint)(iVar6 < iVar5);
    break;
  case 0xe:
    iVar6 = top_and_pop<int>(this);
    iVar5 = top_and_pop<int>(this);
    uVar7 = (uint)(iVar5 < iVar6);
    break;
  case 0xf:
    iVar6 = top_and_pop<int>(this);
    iVar5 = top_and_pop<int>(this);
    uVar7 = (uint)(iVar5 <= iVar6);
    break;
  case 0x10:
    iVar6 = top_and_pop<int>(this);
    iVar5 = top_and_pop<int>(this);
    uVar7 = iVar6 * iVar5;
    break;
  case 0x11:
    iVar6 = top_and_pop<int>(this);
    iVar5 = top_and_pop<int>(this);
    uVar7 = iVar5 % iVar6;
    break;
  case 0x12:
    iVar6 = top_and_pop<int>(this);
    iVar5 = top_and_pop<int>(this);
    uVar7 = (uint)(iVar5 != iVar6);
    break;
  case 0x13:
    iVar6 = top_and_pop<int>(this);
    iVar5 = top_and_pop<int>(this);
    uVar7 = iVar6 + iVar5;
    break;
  case 0x14:
    iVar6 = top_and_pop<int>(this);
    uVar7 = -iVar6;
    break;
  case 0x15:
    iVar6 = top_and_pop<int>(this);
    bVar14 = iVar6 == 0;
LAB_00193e09:
    uVar7 = (uint)bVar14;
    break;
  case 0x16:
    *bytecode = pbVar1 + 1;
    lVar8 = pbVar1[1];
    iVar6 = top_and_pop<int>(this);
    _value = CONCAT44(uStack_1b4,iVar6);
    right_id = top_and_pop<unsigned_int>(this);
    left_id = top_and_pop<unsigned_int>(this);
    local_1fc = (ineq_cmp_t)(lVar8 != 0);
    std::vector<tchecker::clock_constraint_t,std::allocator<tchecker::clock_constraint_t>>::
    emplace_back<unsigned_int_const&,unsigned_int_const&,tchecker::ineq_cmp_t,int_const&>
              ((vector<tchecker::clock_constraint_t,std::allocator<tchecker::clock_constraint_t>> *)
               clkconstr,&left_id,&right_id,&local_1fc,&value);
    return 1;
  case 0x17:
    iVar6 = top_and_pop<int>(this);
    _value = CONCAT44(uStack_1b4,iVar6);
    right_id = top_and_pop<unsigned_int>(this);
    left_id = top_and_pop<unsigned_int>(this);
    std::vector<tchecker::clock_reset_t,std::allocator<tchecker::clock_reset_t>>::
    emplace_back<unsigned_int_const&,unsigned_int_const&,int_const&>
              ((vector<tchecker::clock_reset_t,std::allocator<tchecker::clock_reset_t>> *)clkreset,
               &left_id,&right_id,&value);
    return 1;
  case 0x18:
    std::
    vector<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>,_std::allocator<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>_>_>
    ::emplace_back<>(&this->_frames);
    return 1;
  case 0x19:
    std::
    vector<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>,_std::allocator<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>_>_>
    ::pop_back(&this->_frames);
    return 1;
  case 0x1a:
    lVar8 = top_and_pop<long>(this);
    puVar12 = (uint *)slot_of(this,lVar8);
LAB_00193cf1:
    uVar7 = *puVar12;
    break;
  case 0x1b:
    iVar6 = top_and_pop<int>(this);
    uVar7 = top_and_pop<unsigned_int>(this);
    piVar11 = slot_of(this,(ulong)uVar7);
LAB_00193ec2:
    *piVar11 = iVar6;
    return iVar6;
  case 0x1c:
    uVar7 = top_and_pop<unsigned_int>(this);
    uVar4 = top_and_pop<unsigned_short>(this);
    _value = (ulong)uVar4;
    puVar12 = (uint *)std::
                      map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>
                      ::operator[]((this->_frames).
                                   super__Vector_base<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>,_std::allocator<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + -1,
                                   (key_type_conflict *)&value);
    *puVar12 = uVar7;
LAB_00193ef2:
    iVar13 = 0;
switchD_00193a52_caseD_1d:
    return iVar13;
  case 0x1d:
    goto switchD_00193a52_caseD_1d;
  default:
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"incomplete switch statement");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  push<int>(this,uVar7);
LAB_00193e31:
  iVar6 = top<int>(this);
  return iVar6;
}

Assistant:

inline tchecker::integer_t interpret_instruction(tchecker::bytecode_t const *& bytecode, tchecker::intval_t & intval,
                                                   tchecker::clock_constraint_container_t & clkconstr,
                                                   tchecker::clock_reset_container_t & clkreset)
  {
    // Assume stack=v1 ... vK where vK is the top symbol
    switch (*bytecode) {
      // end of operation, return vK
    case VM_RET: {
      auto val = top_and_pop<tchecker::integer_t>();
      assert(size() == 0);
      clear();
      _return = true;
      return val;
    }

      // end of operation when vK==0, return 0
    case VM_RETZ: {
      if (top<tchecker::integer_t>() == 0) {
        clear();
        _return = true;
        return 0;
      }
      return top<tchecker::integer_t>();
    }

      // raise exception when not (l <= vK <= h) for parameters l and h
      // of instruction VM_FAILNOTIN
    case VM_FAILNOTIN: {
      tchecker::bytecode_t const l = *++bytecode;
      tchecker::bytecode_t const h = *++bytecode;
      auto const offset = top<tchecker::bytecode_t>();
      assert(contains_value<tchecker::integer_t>(l));
      assert(contains_value<tchecker::integer_t>(h));
      assert(contains_value<tchecker::integer_t>(offset));
      if ((offset < l) || (offset > h)) {
        std::stringstream ss;
        ss << offset << " out of [" << l << ", " << h << "]";
        throw std::out_of_range("out-of-bounds value: " + ss.str());
      }

      return top<tchecker::integer_t>();
    }

      // unconditional jump relatively to next instruction;
      // offset is a parameter of the instruction
    case VM_JMP: {
      tchecker::bytecode_t const shift = *++bytecode;
      // jump is relative to the address of the next instruction:
      // - bytecode++;
      // but we have to handle the increment of the IP in the main loop:
      // - bytecode += shift - 1;
      // so:
      bytecode += shift;

      return 1;
    }
      // stack = v1 ... vK   jump if vK == 0
      // offset is a parameter of the instruction
    case VM_JMPZ: {
      tchecker::bytecode_t const shift = *++bytecode;

      if (top_and_pop<tchecker::integer_t>() == 0) {
        bytecode += shift;
        return 0;
      }
      return 1;
    }

      // stack = v1 ... vK v   where v is a parameter of instruction VM_PUSH
    case VM_PUSH: {
      tchecker::bytecode_t const v = *++bytecode;
      push<tchecker::bytecode_t>(v);
      return top<tchecker::integer_t>();
    }

      // stack = v1 ... [vK]   vK replaced by value at ID vK in intvars
      // valuation
    case VM_VALUEAT: {
      auto const id = top_and_pop<tchecker::intval_base_t::capacity_t>();
      assert(id < intval.size());
      push<tchecker::integer_t>(intval[id]);
      return top<tchecker::integer_t>();
    }

      // [vK-1] = vK, stack = v1 ... vK-2
    case VM_ASSIGN: {
      auto const value = top_and_pop<tchecker::integer_t>();
      auto const id = top_and_pop<tchecker::intval_base_t::capacity_t>();
      assert(id < intval.size());
      intval[id] = value;
      return value;
    }

      // stack = v1 ... vK-2 (vK-1 && vK)
    case VM_LAND: {
      auto const right = top_and_pop<tchecker::integer_t>();
      auto const left = top_and_pop<tchecker::integer_t>();
      push<tchecker::integer_t>(left && right);
      return top<tchecker::integer_t>();
    }

      // stack = v1 ... vK-2 (vK-1 - vK)
    case VM_MINUS: {
      auto const right = top_and_pop<tchecker::integer_t>();
      auto const left = top_and_pop<tchecker::integer_t>();
      push<tchecker::integer_t>(left - right);
      return top<tchecker::integer_t>();
    }

      // stack = v1 ... vK-2 (vK-1 / vK)
    case VM_DIV: {
      auto const right = top_and_pop<tchecker::integer_t>();
      auto const left = top_and_pop<tchecker::integer_t>();
      push<tchecker::integer_t>(left / right);
      return top<tchecker::integer_t>();
    }

      // stack = v1 ... vK-2 (vK-1 == vK)
    case VM_EQ: {
      auto const right = top_and_pop<tchecker::integer_t>();
      auto const left = top_and_pop<tchecker::integer_t>();
      push<tchecker::integer_t>(left == right);
      return top<tchecker::integer_t>();
    }

      // stack = v1 ... vK-2 (vK-1 >= vK)
    case VM_GE: {
      auto const right = top_and_pop<tchecker::integer_t>();
      auto const left = top_and_pop<tchecker::integer_t>();
      push<tchecker::integer_t>(left >= right);
      return top<tchecker::integer_t>();
    }

      // stack = v1 ... vK-2 (vK-1 > vK)
    case VM_GT: {
      auto const right = top_and_pop<tchecker::integer_t>();
      auto const left = top_and_pop<tchecker::integer_t>();
      push<tchecker::integer_t>(left > right);
      return top<tchecker::integer_t>();
    }

      // stack = v1 ... vK-2 (vK-1 < vK)
    case VM_LT: {
      auto const right = top_and_pop<tchecker::integer_t>();
      auto const left = top_and_pop<tchecker::integer_t>();
      push<tchecker::integer_t>(left < right);
      return top<tchecker::integer_t>();
    }

      // stack = v1 ... vK-2 (vK-1 <= vK)
    case VM_LE: {
      auto const right = top_and_pop<tchecker::integer_t>();
      auto const left = top_and_pop<tchecker::integer_t>();
      push<tchecker::integer_t>(left <= right);
      return top<tchecker::integer_t>();
    }

      // stack = v1 ... vK-2 (vK-1 * vK)
    case VM_MUL: {
      auto const right = top_and_pop<tchecker::integer_t>();
      auto const left = top_and_pop<tchecker::integer_t>();
      push<tchecker::integer_t>(left * right);
      return top<tchecker::integer_t>();
    }

      // stack = v1 ... vK-2 (vK-1 % vK)
    case VM_MOD: {
      auto const right = top_and_pop<tchecker::integer_t>();
      auto const left = top_and_pop<tchecker::integer_t>();
      push<tchecker::integer_t>(left % right);
      return top<tchecker::integer_t>();
    }

      // stack = v1 ... vK-2 (vK-1 != vK)
    case VM_NE: {
      auto const right = top_and_pop<tchecker::integer_t>();
      auto const left = top_and_pop<tchecker::integer_t>();
      push<tchecker::integer_t>(left != right);
      return top<tchecker::integer_t>();
    }

      // stack = v1 ... vK-2 (vK-1 + vK)
    case VM_SUM: {
      auto const right = top_and_pop<tchecker::integer_t>();
      auto const left = top_and_pop<tchecker::integer_t>();
      push<tchecker::integer_t>(left + right);
      return top<tchecker::integer_t>();
    }

      // stack = v1 ... vK-1 (- vK)
    case VM_NEG: {
      auto const v = top_and_pop<tchecker::integer_t>();
      push<tchecker::integer_t>(-v);
      return top<tchecker::integer_t>();
    }

      // stack = v1 ... vK-1 (! vK)
    case VM_LNOT: {
      auto const v = top_and_pop<tchecker::integer_t>();
      push<tchecker::integer_t>(!v);
      return top<tchecker::integer_t>();
    }

      // no-operation
    case VM_NOP:
      return 1;

      // stack = v1 ... vK-4 1  output (vK-2 vK-1 s vK)   where s is a
      // parameter of VM_CLKCONSTR (strictness)
    case VM_CLKCONSTR: {
      tchecker::bytecode_t cmp = *++bytecode;
      auto const bound = top_and_pop<tchecker::integer_t>();
      auto const id2 = top_and_pop<tchecker::clock_id_t>();
      auto const id1 = top_and_pop<tchecker::clock_id_t>();
      static_assert(tchecker::LT == 0, "");
      clkconstr.emplace_back(id1, id2, (cmp == 0 ? tchecker::LT : tchecker::LE), bound);
      return 1;
    }

      // stack = v1 ... vK-3    output (vK-2 vK-1 vK)
    case VM_CLKRESET: {
      auto const value = top_and_pop<tchecker::integer_t>();
      auto const right_id = top_and_pop<tchecker::clock_id_t>();
      auto const left_id = top_and_pop<tchecker::clock_id_t>();
      clkreset.emplace_back(left_id, right_id, value);
      return 1;
    }

      // push a new frame for local variables
    case VM_PUSH_FRAME: {
      _frames.emplace_back();
      return 1;
    }
      // pop the top-level frame
    case VM_POP_FRAME: {
      _frames.pop_back();
      return 1;
    }

      // stack = v1 ... vK-1 [vK]
      // vK is replaced by the value of the local variable identified by vK.
    case VM_VALUEAT_FRAME: {
      auto const id = top_and_pop<tchecker::bytecode_t>();
      push<tchecker::integer_t>(slot_of(id));
      return top<tchecker::integer_t>();
    }

      // stack = v1 ... vK-2
      // [vK-1] is assigned vK where vK-1 identifies a local variables.
    case VM_ASSIGN_FRAME: {
      auto const value = top_and_pop<tchecker::integer_t>();
      auto const id = top_and_pop<tchecker::intvar_id_t>();
      slot_of(id) = value;
      return value;
    }

      // stack = v1 ... vK-2
      // [vK-1] is initialized with vK where vK-1 identifies a local variables.
    case VM_INIT_FRAME: {
      auto const value = top_and_pop<tchecker::intvar_id_t>();
      auto const id = top_and_pop<tchecker::intval_base_t::capacity_t>();
      _frames.back()[id] = static_cast<tchecker::integer_t>(value);

      return 0;
    }
    }

    // should never be reached
    throw std::runtime_error("incomplete switch statement");
  }